

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

Image * __thiscall
deqp::gls::FboUtil::config::Framebuffer::getImage(Framebuffer *this,GLenum type,GLuint imgName)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  
  if (type == 0x8d41) {
    p_Var3 = &(this->rbos)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = p_Var3;
    for (p_Var2 = (this->rbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4]) {
      bVar4 = p_Var2[1]._M_color < imgName;
      if (!bVar4) {
        p_Var1 = p_Var2;
      }
    }
  }
  else {
    if (type != 0x1702) {
      return (Image *)0x0;
    }
    p_Var3 = &(this->textures)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = p_Var3;
    for (p_Var2 = (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4]) {
      bVar4 = p_Var2[1]._M_color < imgName;
      if (!bVar4) {
        p_Var1 = p_Var2;
      }
    }
  }
  p_Var2 = p_Var3;
  if ((p_Var1 != p_Var3) && (p_Var2 = p_Var1, imgName < p_Var1[1]._M_color)) {
    p_Var2 = p_Var3;
  }
  if (p_Var2 == p_Var3) {
    return (Image *)0x0;
  }
  return (Image *)p_Var2[1]._M_parent;
}

Assistant:

const Image* Framebuffer::getImage (GLenum type, glw::GLuint imgName) const
{
	switch (type)
	{
		case GL_TEXTURE:
			return de::lookupDefault(textures, imgName, DE_NULL);
		case GL_RENDERBUFFER:
			return de::lookupDefault(rbos, imgName, DE_NULL);
		default:
			DE_FATAL("Bad image type");
	}
	return DE_NULL; // shut up compiler warning
}